

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmetatype.cpp
# Opt level: O0

char * QDBusMetaType::typeToSignature(QMetaType type)

{
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  QDBusCustomTypeInfo *pQVar4;
  QHash<int,_QDBusCustomTypeInfo> *this;
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  QMetaType in_stack_00000008;
  QDBusCustomTypeInfo *info;
  QDBusCustomTypeInfo *info_1;
  Type *ct;
  QWriteLocker locker_1;
  QByteArray signature;
  const_iterator it;
  QReadLocker locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypes>_>
  *in_stack_ffffffffffffff18;
  const_iterator *in_stack_ffffffffffffff20;
  QHash<int,_QDBusCustomTypeInfo> *this_00;
  char *local_a8;
  QByteArray local_88;
  piter local_70;
  const_iterator local_60;
  int local_4c;
  piter local_48;
  undefined1 *local_38;
  QMetaTypeInterface *local_30;
  QMetaTypeInterface *local_28;
  QMetaTypeInterface *local_20;
  QMetaTypeInterface *local_18;
  EVP_PKEY_CTX local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = local_10;
  iVar2 = QMetaType::id((QMetaType *)in_stack_ffffffffffffff20,
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  this = (QHash<int,_QDBusCustomTypeInfo> *)(ulong)(iVar2 - 1);
  switch(this) {
  case (QHash<int,_QDBusCustomTypeInfo> *)0x0:
    local_a8 = "b";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0x1:
    local_a8 = "i";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0x2:
    local_a8 = "u";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0x3:
    local_a8 = "x";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0x4:
    local_a8 = "t";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0x5:
    local_a8 = "d";
    break;
  default:
    QDBusMetaTypeId::init(ctx);
    local_18 = (QMetaTypeInterface *)QDBusMetaTypeId::variant();
    bVar1 = ::operator==((QMetaType *)in_stack_ffffffffffffff20,
                         (QMetaType *)in_stack_ffffffffffffff18);
    if (bVar1) {
      local_a8 = "v";
    }
    else {
      local_20 = (QMetaTypeInterface *)QDBusMetaTypeId::objectpath();
      bVar1 = ::operator==((QMetaType *)in_stack_ffffffffffffff20,
                           (QMetaType *)in_stack_ffffffffffffff18);
      if (bVar1) {
        local_a8 = "o";
      }
      else {
        local_28 = (QMetaTypeInterface *)QDBusMetaTypeId::signature();
        bVar1 = ::operator==((QMetaType *)in_stack_ffffffffffffff20,
                             (QMetaType *)in_stack_ffffffffffffff18);
        if (bVar1) {
          local_a8 = "g";
        }
        else {
          local_30 = (QMetaTypeInterface *)QDBusMetaTypeId::unixfd();
          bVar1 = ::operator==((QMetaType *)in_stack_ffffffffffffff20,
                               (QMetaType *)in_stack_ffffffffffffff18);
          if (bVar1) {
            local_a8 = "h";
          }
          else {
            pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypes>_>
                     ::operator()(in_stack_ffffffffffffff18);
            if (pTVar3 == (Type *)0x0) {
              local_a8 = (char *)0x0;
            }
            else {
              local_38 = &DAT_aaaaaaaaaaaaaaaa;
              QReadLocker::QReadLocker
                        ((QReadLocker *)in_stack_ffffffffffffff20,
                         (QReadWriteLock *)in_stack_ffffffffffffff18);
              local_48.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
              local_48.d = (Data<QHashPrivate::Node<int,_QDBusCustomTypeInfo>_> *)
                           &DAT_aaaaaaaaaaaaaaaa;
              this_00 = &pTVar3->hash;
              local_4c = QMetaType::id((QMetaType *)in_stack_ffffffffffffff20,
                                       (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
              local_48 = (piter)QHash<int,_QDBusCustomTypeInfo>::constFind
                                          ((QHash<int,_QDBusCustomTypeInfo> *)
                                           in_stack_ffffffffffffff20,
                                           (int *)in_stack_ffffffffffffff18);
              local_70 = (piter)QHash<int,_QDBusCustomTypeInfo>::end(this_00);
              QHash<int,_QDBusCustomTypeInfo>::const_iterator::const_iterator
                        (&local_60,(iterator *)&local_70);
              bVar1 = QHash<int,_QDBusCustomTypeInfo>::const_iterator::operator==
                                ((const_iterator *)this_00,in_stack_ffffffffffffff20);
              if (bVar1) {
                local_a8 = (char *)0x0;
                bVar1 = true;
              }
              else {
                pQVar4 = QHash<int,_QDBusCustomTypeInfo>::const_iterator::operator*
                                   ((const_iterator *)0x1ce0c9);
                bVar1 = QByteArray::isNull((QByteArray *)0x1ce0d8);
                if (bVar1) {
                  if (pQVar4->marshall == (MarshallFunction)0x0) {
                    local_a8 = (char *)0x0;
                    bVar1 = true;
                  }
                  else {
                    bVar1 = false;
                  }
                }
                else {
                  local_a8 = QByteArray::operator_cast_to_char_((QByteArray *)0x1ce0e6);
                  bVar1 = true;
                }
              }
              QReadLocker::~QReadLocker((QReadLocker *)0x1ce129);
              if (!bVar1) {
                local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
                local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                QDBusArgumentPrivate::createSignature(in_stack_00000008);
                QWriteLocker::QWriteLocker
                          ((QWriteLocker *)in_stack_ffffffffffffff20,
                           (QReadWriteLock *)in_stack_ffffffffffffff18);
                QMetaType::id((QMetaType *)&pTVar3->hash,
                              (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
                pQVar4 = QHash<int,_QDBusCustomTypeInfo>::operator[](this,(int *)this_00);
                QByteArray::operator=(&pQVar4->signature,&local_88);
                QWriteLocker::~QWriteLocker((QWriteLocker *)0x1ce1f0);
                QByteArray::~QByteArray((QByteArray *)0x1ce1fa);
                local_a8 = QByteArray::operator_cast_to_char_((QByteArray *)0x1ce204);
              }
            }
          }
        }
      }
    }
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0x9:
    local_a8 = "s";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0xa:
    local_a8 = "as";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0xb:
    local_a8 = "ay";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0x20:
    local_a8 = "n";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0x23:
    local_a8 = "q";
    break;
  case (QHash<int,_QDBusCustomTypeInfo> *)0x24:
    local_a8 = "y";
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_a8;
  }
  __stack_chk_fail();
}

Assistant:

const char *QDBusMetaType::typeToSignature(QMetaType type)
{
    // check if it's a static type
    switch (type.id())
    {
    case QMetaType::UChar:
        return DBUS_TYPE_BYTE_AS_STRING;

    case QMetaType::Bool:
        return DBUS_TYPE_BOOLEAN_AS_STRING;

    case QMetaType::Short:
        return DBUS_TYPE_INT16_AS_STRING;

    case QMetaType::UShort:
        return DBUS_TYPE_UINT16_AS_STRING;

    case QMetaType::Int:
        return DBUS_TYPE_INT32_AS_STRING;

    case QMetaType::UInt:
        return DBUS_TYPE_UINT32_AS_STRING;

    case QMetaType::LongLong:
        return DBUS_TYPE_INT64_AS_STRING;

    case QMetaType::ULongLong:
        return DBUS_TYPE_UINT64_AS_STRING;

    case QMetaType::Double:
        return DBUS_TYPE_DOUBLE_AS_STRING;

    case QMetaType::QString:
        return DBUS_TYPE_STRING_AS_STRING;

    case QMetaType::QStringList:
        return DBUS_TYPE_ARRAY_AS_STRING
            DBUS_TYPE_STRING_AS_STRING; // as

    case QMetaType::QByteArray:
        return DBUS_TYPE_ARRAY_AS_STRING
            DBUS_TYPE_BYTE_AS_STRING; // ay
    }

    QDBusMetaTypeId::init();
    if (type == QDBusMetaTypeId::variant())
        return DBUS_TYPE_VARIANT_AS_STRING;
    else if (type == QDBusMetaTypeId::objectpath())
        return DBUS_TYPE_OBJECT_PATH_AS_STRING;
    else if (type == QDBusMetaTypeId::signature())
        return DBUS_TYPE_SIGNATURE_AS_STRING;
    else if (type == QDBusMetaTypeId::unixfd())
        return DBUS_TYPE_UNIX_FD_AS_STRING;

    // try the database
    auto *ct = customTypes();
    if (!ct)
        return nullptr;

    {
        QReadLocker locker(&ct->lock);
        auto it = ct->hash.constFind(type.id());
        if (it == ct->hash.end())
            return nullptr;

        const QDBusCustomTypeInfo &info = *it;

        if (!info.signature.isNull())
            return info.signature;

        if (!info.marshall)
            return nullptr;           // type not registered with us
    }

    // call to user code to construct the signature type
    QDBusCustomTypeInfo *info;
    {
        // createSignature will never return a null QByteArray
        // if there was an error, it'll return ""
        QByteArray signature = QDBusArgumentPrivate::createSignature(type);

        // re-acquire lock
        QWriteLocker locker(&ct->lock);
        info = &ct->hash[type.id()];
        info->signature = signature;
    }
    return info->signature;
}